

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O3

int RAWToRGBA(uint8_t *src_raw,int src_stride_raw,uint8_t *dst_rgba,int dst_stride_rgba,int width,
             int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  
  iVar1 = -1;
  if ((height != 0 && 0 < width) && (dst_rgba != (uint8_t *)0x0 && src_raw != (uint8_t *)0x0)) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_raw = src_raw + ~height * src_stride_raw;
      src_stride_raw = -src_stride_raw;
    }
    if (width * 4 == dst_stride_rgba && width * 3 == src_stride_raw) {
      width = iVar1 * width;
      src_stride_raw = 0;
      dst_stride_rgba = 0;
      iVar1 = 1;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar3 = RAWToRGBARow_SSSE3;
    }
    else {
      pcVar3 = RAWToRGBARow_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar3 = RAWToRGBARow_C;
    }
    do {
      (*pcVar3)(src_raw,dst_rgba,width);
      src_raw = src_raw + src_stride_raw;
      dst_rgba = dst_rgba + dst_stride_rgba;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int RAWToRGBA(const uint8_t* src_raw,
              int src_stride_raw,
              uint8_t* dst_rgba,
              int dst_stride_rgba,
              int width,
              int height) {
  int y;
  void (*RAWToRGBARow)(const uint8_t* src_rgb, uint8_t* dst_rgba, int width) =
      RAWToRGBARow_C;
  if (!src_raw || !dst_rgba || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_raw = src_raw + (height - 1) * src_stride_raw;
    src_stride_raw = -src_stride_raw;
  }
  // Coalesce rows.
  if (src_stride_raw == width * 3 && dst_stride_rgba == width * 4) {
    width *= height;
    height = 1;
    src_stride_raw = dst_stride_rgba = 0;
  }
#if defined(HAS_RAWTORGBAROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    RAWToRGBARow = RAWToRGBARow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      RAWToRGBARow = RAWToRGBARow_SSSE3;
    }
  }
#endif
#if defined(HAS_RAWTORGBAROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    RAWToRGBARow = RAWToRGBARow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      RAWToRGBARow = RAWToRGBARow_NEON;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    RAWToRGBARow(src_raw, dst_rgba, width);
    src_raw += src_stride_raw;
    dst_rgba += dst_stride_rgba;
  }
  return 0;
}